

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

_Bool place_new_monster(chunk *c,loc grid,monster_race *race,_Bool sleep,_Bool group_ok,
                       monster_group_info group_info,uint8_t origin)

{
  monster_group_info group_info_00;
  monster_group_info group_info_01;
  monster_group_info group_info_02;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t total;
  monster_race *friends_race;
  monster_friends *pmVar4;
  monster_friends_base *pmVar5;
  
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x865,
                  "_Bool place_new_monster(struct chunk *, struct loc, struct monster_race *, _Bool, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  if (race != (monster_race *)0x0) {
    if (group_info.index == L'\0') {
      group_info.index = monster_group_index_new((chunk_conflict *)c);
    }
    group_info_00.role = group_info.role;
    group_info_00.index = group_info.index;
    group_info_00.player_race = group_info.player_race;
    _Var1 = place_new_monster_one(c,grid,race,sleep,group_info_00,origin);
    if (group_ok && _Var1) {
      pmVar4 = (monster_friends *)&race->friends;
      while (pmVar4 = pmVar4->next, pmVar4 != (monster_friends *)0x0) {
        uVar2 = Rand_div(100);
        if (uVar2 < pmVar4->percent_chance) {
          wVar3 = damroll(pmVar4->number_dice,pmVar4->number_side);
          group_info_01.role = pmVar4->role;
          group_info_01.index = group_info.index;
          group_info_01.player_race = group_info.player_race;
          place_friends(c,grid,race,pmVar4->race,wVar3,sleep,group_info_01,origin);
        }
      }
      pmVar5 = (monster_friends_base *)&race->friends_base;
      while (pmVar5 = pmVar5->next, pmVar5 != (monster_friends_base *)0x0) {
        uVar2 = Rand_div(100);
        if (uVar2 < pmVar5->percent_chance) {
          wVar3 = pmVar5->number_side;
          total = damroll(pmVar5->number_dice,wVar3);
          place_monster_base = pmVar5->base;
          get_mon_num_prep(place_monster_base_okay);
          friends_race = get_mon_num(race->level,wVar3);
          get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
          if (friends_race == (monster_race *)0x0) {
            return _Var1;
          }
          group_info_02.role = pmVar5->role;
          group_info_02.index = group_info.index;
          group_info_02.player_race = group_info.player_race;
          place_friends(c,grid,race,friends_race,total,sleep,group_info_02,origin);
        }
      }
    }
    return _Var1;
  }
  __assert_fail("race",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                ,0x866,
                "_Bool place_new_monster(struct chunk *, struct loc, struct monster_race *, _Bool, _Bool, struct monster_group_info, uint8_t)"
               );
}

Assistant:

bool place_new_monster(struct chunk *c, struct loc grid,
		struct monster_race *race, bool sleep, bool group_ok,
		struct monster_group_info group_info, uint8_t origin)
{
	struct monster_friends *friends;
	struct monster_friends_base *friends_base;
	int total;

	assert(c);
	assert(race);

	/* If we don't have a group index already, make one; our first monster
	 * will be the leader */
	if (!group_info.index) {
		group_info.index = monster_group_index_new(c);
	}

	/* Place one monster, or fail */
	if (!place_new_monster_one(c, grid, race, sleep, group_info, origin)) {
		return (false);
	}

	/* We're done unless the group flag is set */
	if (!group_ok) return (true);

	/* Go through friends flags */
	for (friends = race->friends; friends; friends = friends->next) {
		if ((unsigned int)randint0(100) >= friends->percent_chance)
			continue;

		/* Calculate the base number of monsters to place */
		total = damroll(friends->number_dice, friends->number_side);

		/* Set group role */
		group_info.role = friends->role;

		/* Place them */
		place_friends(c, grid, race, friends->race, total, sleep, group_info,
					  origin);

	}

	/* Go through the friends_base flags */
	for (friends_base = race->friends_base; friends_base;
			friends_base = friends_base->next){
		struct monster_race *friends_race;

		/* Check if we pass chance for the monster appearing */
		if ((unsigned int)randint0(100) >= friends_base->percent_chance)
			continue;

		total = damroll(friends_base->number_dice, friends_base->number_side);

		/* Set the escort index base*/
		place_monster_base = friends_base->base;

		/* Prepare allocation table */
		get_mon_num_prep(place_monster_base_okay);

		/* Pick a random race */
		friends_race = get_mon_num(race->level, c->depth);

		/* Reset allocation table */
		get_mon_num_prep(NULL);

		/* Handle failure */
		if (!friends_race) break;

		/* Set group role */
		group_info.role = friends_base->role;

		/* Place them */
		place_friends(c, grid, race, friends_race, total, sleep, group_info,
					  origin);
	}

	/* Success */
	return (true);
}